

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::chromeCallLoggingExit
          (CLIntercept *this,char *functionName,string *tag,bool includeId,uint64_t enqueueCounter,
          time_point tickStart,time_point tickEnd)

{
  CChromeTracer *this_00;
  int iVar1;
  uint64_t threadId;
  uint64_t delta;
  uint64_t startTime;
  
  std::mutex::lock(&this->m_Mutex);
  iVar1 = gettid();
  threadId = (uint64_t)iVar1;
  getThreadNumber(this,threadId);
  delta = (long)tickEnd.__d.__r - (long)tickStart.__d.__r;
  this_00 = &this->m_ChromeTrace;
  startTime = (long)tickStart.__d.__r - (this->m_StartTime).__d.__r;
  if (includeId && tag->_M_string_length != 0) {
    CChromeTracer::addCallLogging(this_00,functionName,tag,threadId,startTime,delta,enqueueCounter);
  }
  else if (tag->_M_string_length == 0) {
    if (includeId) {
      CChromeTracer::addCallLogging(this_00,functionName,threadId,startTime,delta,enqueueCounter);
    }
    else {
      CChromeTracer::addCallLogging(this_00,functionName,threadId,startTime,delta);
    }
  }
  else {
    CChromeTracer::addCallLogging(this_00,functionName,tag,threadId,startTime,delta);
  }
  if ((this->m_Config).FlushFiles == true) {
    CChromeTracer::flush(this_00);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::chromeCallLoggingExit(
    const char* functionName,
    const std::string& tag,
    bool includeId,
    const uint64_t enqueueCounter,
    clock::time_point tickStart,
    clock::time_point tickEnd )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    uint64_t    threadId = OS().GetThreadID();

    // This will name the thread if it is not named already.
    getThreadNumber( threadId );

    using ns = std::chrono::nanoseconds;
    uint64_t    nsStart =
        std::chrono::duration_cast<ns>(tickStart - m_StartTime).count();
    uint64_t    nsDelta =
        std::chrono::duration_cast<ns>(tickEnd - tickStart).count();

    if( !tag.empty() && includeId )
    {
        m_ChromeTrace.addCallLogging( functionName, tag, threadId, nsStart, nsDelta, enqueueCounter );
    }
    else if( !tag.empty() )
    {
        m_ChromeTrace.addCallLogging( functionName, tag, threadId, nsStart, nsDelta );
    }
    else if( includeId )
    {
        m_ChromeTrace.addCallLogging( functionName, threadId, nsStart, nsDelta, enqueueCounter );
    }
    else
    {
        m_ChromeTrace.addCallLogging( functionName, threadId, nsStart, nsDelta );
    }

    if( m_Config.FlushFiles )
    {
        m_ChromeTrace.flush();
    }
}